

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglSwapBuffersWithDamageTests.cpp
# Opt level: O0

void deqp::egl::anon_unknown_0::clearColorScreen(Functions *gl,Vec4 *clearColor)

{
  glClearColorFunc p_Var1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  Vec4 *clearColor_local;
  Functions *gl_local;
  
  p_Var1 = gl->clearColor;
  fVar2 = tcu::Vector<float,_4>::x(clearColor);
  fVar3 = tcu::Vector<float,_4>::y(clearColor);
  fVar4 = tcu::Vector<float,_4>::z(clearColor);
  fVar5 = tcu::Vector<float,_4>::w(clearColor);
  (*p_Var1)(fVar2,fVar3,fVar4,fVar5);
  (*gl->clear)(0x4000);
  return;
}

Assistant:

void clearColorScreen (const glw::Functions& gl, const tcu::Vec4& clearColor)
{
	gl.clearColor(clearColor.x(), clearColor.y(), clearColor.z(), clearColor.w());
	gl.clear(GL_COLOR_BUFFER_BIT);
}